

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-id.c++
# Opt level: O3

uint64_t __thiscall
capnp::compiler::generateChildId(compiler *this,uint64_t parentId,StringPtr childName)

{
  uchar *puVar1;
  long lVar2;
  ulong uVar3;
  ArrayPtr<const_unsigned_char> AVar4;
  ArrayPtr<const_unsigned_char> dataArray;
  byte parentIdBytes [8];
  uchar local_c0 [12];
  TypeIdGenerator local_b4;
  
  puVar1 = local_c0;
  local_c0[0] = '\0';
  local_c0[1] = '\0';
  local_c0[2] = '\0';
  local_c0[3] = '\0';
  local_c0[4] = '\0';
  local_c0[5] = '\0';
  local_c0[6] = '\0';
  local_c0[7] = '\0';
  lVar2 = 0;
  do {
    *puVar1 = (uchar)((ulong)this >> ((byte)lVar2 & 0x3f));
    puVar1 = puVar1 + 1;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x40);
  local_b4.finished = false;
  local_b4.ctx.c = 0x98badcfe;
  local_b4.ctx.d = 0x10325476;
  local_b4.ctx.lo = 0;
  local_b4.ctx.hi = 0;
  local_b4.ctx.a = 0x67452301;
  local_b4.ctx.b = 0xefcdab89;
  AVar4.size_ = 8;
  AVar4.ptr = local_c0;
  TypeIdGenerator::update(&local_b4,AVar4);
  dataArray.size_ = (size_t)(childName.content.ptr + -1);
  dataArray.ptr = (uchar *)parentId;
  TypeIdGenerator::update(&local_b4,dataArray);
  AVar4 = TypeIdGenerator::finish(&local_b4);
  lVar2 = 0;
  uVar3 = 0;
  do {
    uVar3 = (ulong)AVar4.ptr[lVar2] | uVar3 << 8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return uVar3 | 0x8000000000000000;
}

Assistant:

uint64_t generateChildId(uint64_t parentId, kj::StringPtr childName) {
  // Compute ID by hashing the concatenation of the parent ID and the declaration name, and
  // then taking the first 8 bytes.

  kj::byte parentIdBytes[sizeof(uint64_t)]{};
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    parentIdBytes[i] = (parentId >> (i * 8)) & 0xff;
  }

  TypeIdGenerator generator;
  generator.update(kj::arrayPtr(parentIdBytes, kj::size(parentIdBytes)));
  generator.update(childName);

  kj::ArrayPtr<const kj::byte> resultBytes = generator.finish();

  uint64_t result = 0;
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    result = (result << 8) | resultBytes[i];
  }

  return result | (1ull << 63);
}